

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O1

int KINInit(void *kinmem,KINSysFn func,N_Vector tmpl)

{
  N_Vector_Ops p_Var1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  code *pcVar7;
  long *plVar8;
  int line;
  int iVar9;
  int error_code;
  char *msgfmt;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  sunindextype lrw1;
  sunindextype liw1;
  undefined8 local_40;
  undefined8 local_38;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar9 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x152;
LAB_00108d07:
    KINProcessError((KINMem)kinmem,error_code,line,"KINInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                    ,msgfmt);
    return iVar9;
  }
  if (func == (KINSysFn)0x0) {
    msgfmt = "func = NULL illegal.";
    iVar9 = -2;
    error_code = -2;
    line = 0x15b;
    goto LAB_00108d07;
  }
  p_Var1 = tmpl->ops;
  if ((((((p_Var1->nvclone == (_func_N_Vector_N_Vector *)0x0) ||
         (p_Var1->nvdestroy == (_func_void_N_Vector *)0x0)) ||
        (p_Var1->nvlinearsum == (_func_void_sunrealtype_N_Vector_sunrealtype_N_Vector_N_Vector *)0x0
        )) || (((p_Var1->nvprod == (_func_void_N_Vector_N_Vector_N_Vector *)0x0 ||
                (p_Var1->nvdiv == (_func_void_N_Vector_N_Vector_N_Vector *)0x0)) ||
               ((p_Var1->nvscale == (_func_void_sunrealtype_N_Vector_N_Vector *)0x0 ||
                ((p_Var1->nvabs == (_func_void_N_Vector_N_Vector *)0x0 ||
                 (p_Var1->nvinv == (_func_void_N_Vector_N_Vector *)0x0)))))))) ||
      (p_Var1->nvmaxnorm == (_func_sunrealtype_N_Vector *)0x0)) ||
     ((p_Var1->nvmin == (_func_sunrealtype_N_Vector *)0x0 ||
      (p_Var1->nvwl2norm == (_func_sunrealtype_N_Vector_N_Vector *)0x0)))) {
    msgfmt = "A required vector operation is not implemented.";
    iVar9 = -2;
    error_code = -2;
    line = 0x166;
    goto LAB_00108d07;
  }
  if (p_Var1->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    *(undefined1 (*) [16])((long)kinmem + 0x210) = (undefined1  [16])0x0;
  }
  else {
    N_VSpace(tmpl,&local_40,&local_38);
    *(undefined8 *)((long)kinmem + 0x210) = local_40;
    *(undefined8 *)((long)kinmem + 0x218) = local_38;
  }
  if (*(long *)((long)kinmem + 0x110) == 0) {
    lVar4 = N_VClone(tmpl);
    *(long *)((long)kinmem + 0x110) = lVar4;
    if (lVar4 == 0) goto LAB_00109716;
    *(long *)((long)kinmem + 0x220) =
         *(long *)((long)kinmem + 0x220) + *(long *)((long)kinmem + 0x210);
    *(long *)((long)kinmem + 0x228) =
         *(long *)((long)kinmem + 0x228) + *(long *)((long)kinmem + 0x218);
  }
  if (*(long *)((long)kinmem + 0x118) == 0) {
    lVar4 = N_VClone(tmpl);
    *(long *)((long)kinmem + 0x118) = lVar4;
    if (lVar4 != 0) {
      *(long *)((long)kinmem + 0x220) =
           *(long *)((long)kinmem + 0x220) + *(long *)((long)kinmem + 0x210);
      *(long *)((long)kinmem + 0x228) =
           *(long *)((long)kinmem + 0x228) + *(long *)((long)kinmem + 0x218);
      goto LAB_00108da7;
    }
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
    lVar4 = *(long *)((long)kinmem + 0x210);
    lVar6 = *(long *)((long)kinmem + 0x218);
    lVar12 = *(long *)((long)kinmem + 0x220);
    lVar13 = *(long *)((long)kinmem + 0x228);
LAB_0010933f:
    lVar12 = lVar12 - lVar4;
    lVar13 = lVar13 - lVar6;
LAB_0010970e:
    *(long *)((long)kinmem + 0x220) = lVar12;
    *(long *)((long)kinmem + 0x228) = lVar13;
LAB_00109716:
    KINProcessError((KINMem)kinmem,-4,0x17f,"KINInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                    ,"A memory request failed.");
    free(kinmem);
    return -4;
  }
LAB_00108da7:
  if (*(long *)((long)kinmem + 0x138) == 0) {
    lVar4 = N_VClone(tmpl);
    *(long *)((long)kinmem + 0x138) = lVar4;
    if (lVar4 == 0) {
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
      lVar12 = *(long *)((long)kinmem + 0x220);
      lVar13 = *(long *)((long)kinmem + 0x228);
      lVar4 = *(long *)((long)kinmem + 0x210) * 2;
      lVar6 = *(long *)((long)kinmem + 0x218) * 2;
      goto LAB_0010933f;
    }
    *(long *)((long)kinmem + 0x220) =
         *(long *)((long)kinmem + 0x220) + *(long *)((long)kinmem + 0x210);
    *(long *)((long)kinmem + 0x228) =
         *(long *)((long)kinmem + 0x228) + *(long *)((long)kinmem + 0x218);
  }
  if (*(long *)((long)kinmem + 0x148) == 0) {
    lVar4 = N_VClone(tmpl);
    *(long *)((long)kinmem + 0x148) = lVar4;
    if (lVar4 != 0) {
      *(long *)((long)kinmem + 0x220) =
           *(long *)((long)kinmem + 0x220) + *(long *)((long)kinmem + 0x210);
      *(long *)((long)kinmem + 0x228) =
           *(long *)((long)kinmem + 0x228) + *(long *)((long)kinmem + 0x218);
      goto LAB_00108e23;
    }
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
    lVar10 = *(long *)((long)kinmem + 0x210);
    lVar11 = *(long *)((long)kinmem + 0x218);
    lVar12 = *(long *)((long)kinmem + 0x220);
    lVar13 = *(long *)((long)kinmem + 0x228);
    lVar4 = lVar10 * 2;
    lVar6 = lVar11 * 2;
LAB_00109706:
    lVar12 = lVar12 - (lVar4 + lVar10);
    lVar13 = lVar13 - (lVar6 + lVar11);
    goto LAB_0010970e;
  }
LAB_00108e23:
  if (*(long *)((long)kinmem + 0x150) == 0) {
    lVar4 = N_VClone(tmpl);
    *(long *)((long)kinmem + 0x150) = lVar4;
    if (lVar4 == 0) {
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
      lVar12 = *(long *)((long)kinmem + 0x220);
      lVar13 = *(long *)((long)kinmem + 0x228);
      lVar4 = *(long *)((long)kinmem + 0x210) << 2;
      lVar6 = *(long *)((long)kinmem + 0x218) << 2;
      goto LAB_0010933f;
    }
    *(long *)((long)kinmem + 0x220) =
         *(long *)((long)kinmem + 0x220) + *(long *)((long)kinmem + 0x210);
    *(long *)((long)kinmem + 0x228) =
         *(long *)((long)kinmem + 0x228) + *(long *)((long)kinmem + 0x218);
  }
  lVar4 = *(long *)((long)kinmem + 0x1b8);
  if (lVar4 == 0) goto LAB_00109548;
  if (*(long *)((long)kinmem + 0x1a8) == 0) {
    pvVar5 = malloc(lVar4 * lVar4 * 8);
    *(void **)((long)kinmem + 0x1a8) = pvVar5;
    if (pvVar5 != (void *)0x0) goto LAB_00108e9b;
    KINProcessError((KINMem)kinmem,0,0x3ad,"KINAllocVectors",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                    ,"A memory request failed.");
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
LAB_0010951d:
    lVar4 = *(long *)((long)kinmem + 0x218) * -5;
    lVar6 = -5;
LAB_00109532:
    *(long *)((long)kinmem + 0x228) = *(long *)((long)kinmem + 0x228) + lVar4;
    *(long *)((long)kinmem + 0x220) =
         *(long *)((long)kinmem + 0x220) + lVar6 * *(long *)((long)kinmem + 0x210);
  }
  else {
LAB_00108e9b:
    if (*(long *)((long)kinmem + 0x1a0) == 0) {
      pvVar5 = malloc(lVar4 * 8);
      *(void **)((long)kinmem + 0x1a0) = pvVar5;
      if (pvVar5 != (void *)0x0) goto LAB_00108ec2;
      KINProcessError((KINMem)kinmem,0,0x3bf,"KINAllocVectors",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                      ,"A memory request failed.");
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
      pvVar5 = *(void **)((long)kinmem + 0x1a8);
LAB_00109518:
      free(pvVar5);
      goto LAB_0010951d;
    }
LAB_00108ec2:
    if (*(long *)((long)kinmem + 0x200) == 0) {
      pvVar5 = malloc(lVar4 * 0x10 + 0x10);
      *(void **)((long)kinmem + 0x200) = pvVar5;
      if (pvVar5 == (void *)0x0) {
        KINProcessError((KINMem)kinmem,0,0x3d2,"KINAllocVectors",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                        ,"A memory request failed.");
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
        free(*(void **)((long)kinmem + 0x1a8));
        pvVar5 = *(void **)((long)kinmem + 0x1a0);
        goto LAB_00109518;
      }
    }
    if (*(long *)((long)kinmem + 0x208) == 0) {
      pvVar5 = malloc(lVar4 * 0x10 + 0x10);
      *(void **)((long)kinmem + 0x208) = pvVar5;
      if (pvVar5 == (void *)0x0) {
        KINProcessError((KINMem)kinmem,0,0x3e6,"KINAllocVectors",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                        ,"A memory request failed.");
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
        free(*(void **)((long)kinmem + 0x1a8));
        free(*(void **)((long)kinmem + 0x1a0));
        pvVar5 = *(void **)((long)kinmem + 0x200);
        goto LAB_00109518;
      }
    }
    if (*(long *)((long)kinmem + 0x170) == 0) {
      lVar4 = N_VClone(tmpl);
      *(long *)((long)kinmem + 0x170) = lVar4;
      if (lVar4 == 0) {
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
        free(*(void **)((long)kinmem + 0x1a8));
        free(*(void **)((long)kinmem + 0x1a0));
        free(*(void **)((long)kinmem + 0x200));
        free(*(void **)((long)kinmem + 0x208));
        lVar10 = *(long *)((long)kinmem + 0x210);
        lVar11 = *(long *)((long)kinmem + 0x218);
        lVar12 = *(long *)((long)kinmem + 0x220);
        lVar13 = *(long *)((long)kinmem + 0x228);
        lVar4 = lVar10 << 2;
        lVar6 = lVar11 << 2;
        goto LAB_00109706;
      }
      *(long *)((long)kinmem + 0x220) =
           *(long *)((long)kinmem + 0x220) + *(long *)((long)kinmem + 0x210);
      *(long *)((long)kinmem + 0x228) =
           *(long *)((long)kinmem + 0x228) + *(long *)((long)kinmem + 0x218);
    }
    if (*(long *)((long)kinmem + 0x178) == 0) {
      lVar4 = N_VClone(tmpl);
      *(long *)((long)kinmem + 0x178) = lVar4;
      if (lVar4 == 0) {
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
        free(*(void **)((long)kinmem + 0x1a8));
        free(*(void **)((long)kinmem + 0x1a0));
        free(*(void **)((long)kinmem + 0x200));
        free(*(void **)((long)kinmem + 0x208));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x170));
        uVar2 = *(ulong *)((long)kinmem + 0x210);
        uVar3 = *(ulong *)((long)kinmem + 0x218);
        lVar12 = ((uVar2 & 0xffffffff) * 0xffffffff + (uVar2 >> 0x20) * 0xfffffffa << 0x20) +
                 (uVar2 & 0xffffffff) * 0xfffffffa + *(long *)((long)kinmem + 0x220);
        lVar13 = ((uVar3 & 0xffffffff) * 0xffffffff + (uVar3 >> 0x20) * 0xfffffffa << 0x20) +
                 (uVar3 & 0xffffffff) * 0xfffffffa + *(long *)((long)kinmem + 0x228);
        goto LAB_0010970e;
      }
      *(long *)((long)kinmem + 0x220) =
           *(long *)((long)kinmem + 0x220) + *(long *)((long)kinmem + 0x210);
      *(long *)((long)kinmem + 0x228) =
           *(long *)((long)kinmem + 0x228) + *(long *)((long)kinmem + 0x218);
    }
    if (*(long *)((long)kinmem + 0x180) == 0) {
      lVar4 = N_VCloneVectorArray(*(undefined4 *)((long)kinmem + 0x1b8));
      *(long *)((long)kinmem + 0x180) = lVar4;
      if (lVar4 == 0) {
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
        free(*(void **)((long)kinmem + 0x1a8));
        free(*(void **)((long)kinmem + 0x1a0));
        free(*(void **)((long)kinmem + 0x200));
        free(*(void **)((long)kinmem + 0x208));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x170));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x178));
        *(long *)((long)kinmem + 0x220) =
             *(long *)((long)kinmem + 0x210) * -7 + *(long *)((long)kinmem + 0x220);
        *(long *)((long)kinmem + 0x228) =
             *(long *)((long)kinmem + 0x218) * -7 + *(long *)((long)kinmem + 0x228);
        goto LAB_00109716;
      }
      *(long *)((long)kinmem + 0x228) =
           *(long *)((long)kinmem + 0x228) +
           *(long *)((long)kinmem + 0x218) * *(long *)((long)kinmem + 0x1b8);
      *(long *)((long)kinmem + 0x220) =
           *(long *)((long)kinmem + 0x220) +
           *(long *)((long)kinmem + 0x1b8) * *(long *)((long)kinmem + 0x210);
    }
    if (*(long *)((long)kinmem + 0x188) == 0) {
      lVar4 = N_VCloneVectorArray(*(undefined4 *)((long)kinmem + 0x1b8));
      *(long *)((long)kinmem + 0x188) = lVar4;
      if (lVar4 != 0) {
        *(long *)((long)kinmem + 0x228) =
             *(long *)((long)kinmem + 0x228) +
             *(long *)((long)kinmem + 0x218) * *(long *)((long)kinmem + 0x1b8);
        *(long *)((long)kinmem + 0x220) =
             *(long *)((long)kinmem + 0x220) +
             *(long *)((long)kinmem + 0x1b8) * *(long *)((long)kinmem + 0x210);
        goto LAB_00109032;
      }
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
      free(*(void **)((long)kinmem + 0x1a8));
      free(*(void **)((long)kinmem + 0x1a0));
      free(*(void **)((long)kinmem + 0x200));
      free(*(void **)((long)kinmem + 0x208));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x170));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x178));
      N_VDestroyVectorArray
                (*(undefined8 *)((long)kinmem + 0x180),*(undefined4 *)((long)kinmem + 0x1b8));
      lVar4 = *(long *)((long)kinmem + 0x1b8);
LAB_00109a23:
      *(long *)((long)kinmem + 0x228) =
           *(long *)((long)kinmem + 0x228) - *(long *)((long)kinmem + 0x218) * (lVar4 + 7);
      *(long *)((long)kinmem + 0x220) =
           *(long *)((long)kinmem + 0x220) - (lVar4 + 7) * *(long *)((long)kinmem + 0x210);
      goto LAB_00109716;
    }
LAB_00109032:
    if (*(long *)((long)kinmem + 400) == 0) {
      lVar4 = N_VCloneVectorArray(*(undefined4 *)((long)kinmem + 0x1b8));
      *(long *)((long)kinmem + 400) = lVar4;
      if (lVar4 == 0) {
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
        free(*(void **)((long)kinmem + 0x1a8));
        free(*(void **)((long)kinmem + 0x1a0));
        free(*(void **)((long)kinmem + 0x200));
        free(*(void **)((long)kinmem + 0x208));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x170));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x178));
        N_VDestroyVectorArray
                  (*(undefined8 *)((long)kinmem + 0x180),*(undefined4 *)((long)kinmem + 0x1b8));
        N_VDestroyVectorArray
                  (*(undefined8 *)((long)kinmem + 0x188),*(undefined4 *)((long)kinmem + 0x1b8));
        lVar4 = *(long *)((long)kinmem + 0x1b8) * 2;
        goto LAB_00109a23;
      }
      *(long *)((long)kinmem + 0x228) =
           *(long *)((long)kinmem + 0x228) +
           *(long *)((long)kinmem + 0x218) * *(long *)((long)kinmem + 0x1b8);
      *(long *)((long)kinmem + 0x220) =
           *(long *)((long)kinmem + 0x220) +
           *(long *)((long)kinmem + 0x1b8) * *(long *)((long)kinmem + 0x210);
    }
    if (*(long *)((long)kinmem + 0x1f0) == 0) {
      pvVar5 = malloc(0x18);
      *(void **)((long)kinmem + 0x1f0) = pvVar5;
      if (pvVar5 != (void *)0x0) {
        *(long *)((long)kinmem + 0x228) =
             *(long *)((long)kinmem + 0x228) +
             *(long *)((long)kinmem + 0x218) * *(long *)((long)kinmem + 0x1b8);
        *(long *)((long)kinmem + 0x220) =
             *(long *)((long)kinmem + 0x220) +
             *(long *)((long)kinmem + 0x1b8) * *(long *)((long)kinmem + 0x210);
        goto LAB_001090ce;
      }
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
      free(*(void **)((long)kinmem + 0x1a8));
      free(*(void **)((long)kinmem + 0x1a0));
      free(*(void **)((long)kinmem + 0x200));
      free(*(void **)((long)kinmem + 0x208));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x170));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x178));
      N_VDestroyVectorArray
                (*(undefined8 *)((long)kinmem + 0x180),*(undefined4 *)((long)kinmem + 0x1b8));
      N_VDestroyVectorArray
                (*(undefined8 *)((long)kinmem + 0x188),*(undefined4 *)((long)kinmem + 0x1b8));
      N_VDestroyVectorArray
                (*(undefined8 *)((long)kinmem + 400),*(undefined4 *)((long)kinmem + 0x1b8));
      lVar4 = *(long *)((long)kinmem + 0x1b8);
      lVar6 = -7;
LAB_00109b15:
      lVar6 = lVar6 + lVar4 * -3;
      lVar4 = *(long *)((long)kinmem + 0x218) * lVar6;
      goto LAB_00109532;
    }
LAB_001090ce:
    if (*(int *)((long)kinmem + 0x1e0) != 0) {
      if (*(long *)((long)kinmem + 0x158) == 0) {
        lVar4 = N_VClone(tmpl);
        *(long *)((long)kinmem + 0x158) = lVar4;
        if (lVar4 == 0) {
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
          free(*(void **)((long)kinmem + 0x1a8));
          free(*(void **)((long)kinmem + 0x1a0));
          free(*(void **)((long)kinmem + 0x200));
          free(*(void **)((long)kinmem + 0x208));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x170));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x178));
          N_VDestroyVectorArray
                    (*(undefined8 *)((long)kinmem + 0x180),*(undefined4 *)((long)kinmem + 0x1b8));
          N_VDestroyVectorArray
                    (*(undefined8 *)((long)kinmem + 0x188),*(undefined4 *)((long)kinmem + 0x1b8));
          N_VDestroyVectorArray
                    (*(undefined8 *)((long)kinmem + 400),*(undefined4 *)((long)kinmem + 0x1b8));
          free(*(void **)((long)kinmem + 0x1f0));
          lVar4 = *(long *)((long)kinmem + 0x1b8) * -3 + -7;
          *(long *)((long)kinmem + 0x228) =
               *(long *)((long)kinmem + 0x228) + *(long *)((long)kinmem + 0x218) * lVar4;
          *(long *)((long)kinmem + 0x220) =
               *(long *)((long)kinmem + 0x220) + lVar4 * *(long *)((long)kinmem + 0x210);
          goto LAB_00109716;
        }
        *(long *)((long)kinmem + 0x220) =
             *(long *)((long)kinmem + 0x220) + *(long *)((long)kinmem + 0x210);
        *(long *)((long)kinmem + 0x228) =
             *(long *)((long)kinmem + 0x228) + *(long *)((long)kinmem + 0x218);
      }
      if ((*(int *)((long)kinmem + 0x1e0) == 1) && (*(long *)((long)kinmem + 0x1b0) == 0)) {
        pvVar5 = malloc(*(long *)((long)kinmem + 0x1b8) * *(long *)((long)kinmem + 0x1b8) * 8);
        *(void **)((long)kinmem + 0x1b0) = pvVar5;
        if (pvVar5 == (void *)0x0) {
          KINProcessError((KINMem)kinmem,0,0x4ae,"KINAllocVectors",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                          ,"A memory request failed.");
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
          free(*(void **)((long)kinmem + 0x1a8));
          free(*(void **)((long)kinmem + 0x1a0));
          free(*(void **)((long)kinmem + 0x200));
          free(*(void **)((long)kinmem + 0x208));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x170));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x178));
          N_VDestroyVectorArray
                    (*(undefined8 *)((long)kinmem + 0x180),*(undefined4 *)((long)kinmem + 0x1b8));
          N_VDestroyVectorArray
                    (*(undefined8 *)((long)kinmem + 0x188),*(undefined4 *)((long)kinmem + 0x1b8));
          N_VDestroyVectorArray
                    (*(undefined8 *)((long)kinmem + 400),*(undefined4 *)((long)kinmem + 0x1b8));
          free(*(void **)((long)kinmem + 0x1f0));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x158));
          lVar4 = *(long *)((long)kinmem + 0x1b8);
          lVar6 = -8;
          goto LAB_00109b15;
        }
      }
    }
  }
LAB_00109548:
  *(KINSysFn *)((long)kinmem + 0x10) = func;
  *(undefined8 *)((long)kinmem + 600) = 0;
  *(undefined1 (*) [16])((long)kinmem + 0x230) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)kinmem + 0x240) = (undefined1  [16])0x0;
  if (*(long *)((long)kinmem + 0x1b8) == 0) goto switchD_001095ca_default;
  lVar4 = *(long *)((long)kinmem + 0x150);
  lVar6 = *(long *)(lVar4 + 8);
  if (((*(long *)(lVar6 + 0x140) != 0) || (*(long *)(lVar6 + 0x188) != 0)) &&
     (*(long *)(lVar6 + 400) != 0)) {
    *(undefined4 *)((long)kinmem + 0x1fc) = 1;
  }
  switch(*(undefined4 *)((long)kinmem + 0x1e0)) {
  case 0:
    *(code **)((long)kinmem + 0x1e8) = SUNQRAdd_MGS;
    **(long **)((long)kinmem + 0x1f0) = lVar4;
    goto switchD_001095ca_default;
  case 1:
    if (*(int *)((long)kinmem + 0x1fc) == 0) {
      pcVar7 = SUNQRAdd_ICWY;
    }
    else {
      pcVar7 = SUNQRAdd_ICWY_SB;
    }
    *(code **)((long)kinmem + 0x1e8) = pcVar7;
    plVar8 = *(long **)((long)kinmem + 0x1f0);
    *plVar8 = lVar4;
    plVar8[1] = *(long *)((long)kinmem + 0x158);
    lVar4 = *(long *)((long)kinmem + 0x1b0);
    goto LAB_0010966c;
  case 2:
    pcVar7 = SUNQRAdd_CGS2;
    break;
  case 3:
    if (*(int *)((long)kinmem + 0x1fc) == 0) {
      pcVar7 = SUNQRAdd_DCGS2;
    }
    else {
      pcVar7 = SUNQRAdd_DCGS2_SB;
    }
    break;
  default:
    goto switchD_001095ca_default;
  }
  *(code **)((long)kinmem + 0x1e8) = pcVar7;
  plVar8 = *(long **)((long)kinmem + 0x1f0);
  *plVar8 = lVar4;
  plVar8[1] = *(long *)((long)kinmem + 0x158);
  lVar4 = *(long *)((long)kinmem + 0x200);
LAB_0010966c:
  plVar8[2] = lVar4;
switchD_001095ca_default:
  *(undefined4 *)((long)kinmem + 0x2a8) = 1;
  return 0;
}

Assistant:

int KINInit(void* kinmem, KINSysFn func, N_Vector tmpl)
{
  sunindextype liw1, lrw1;
  KINMem kin_mem;
  sunbooleantype allocOK, nvectorOK;

  /* check kinmem */

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  SUNDIALS_MARK_FUNCTION_BEGIN(KIN_PROFILER);

  if (func == NULL)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_FUNC_NULL);
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_ILL_INPUT);
  }

  /* check if all required vector operations are implemented */

  nvectorOK = KINCheckNvector(tmpl);
  if (!nvectorOK)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_NVECTOR);
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_ILL_INPUT);
  }

  /* set space requirements for one N_Vector */

  if (tmpl->ops->nvspace != NULL)
  {
    N_VSpace(tmpl, &lrw1, &liw1);
    kin_mem->kin_lrw1 = lrw1;
    kin_mem->kin_liw1 = liw1;
  }
  else
  {
    kin_mem->kin_lrw1 = 0;
    kin_mem->kin_liw1 = 0;
  }

  /* allocate necessary vectors */

  allocOK = KINAllocVectors(kin_mem, tmpl);
  if (!allocOK)
  {
    KINProcessError(kin_mem, KIN_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    free(kin_mem);
    kin_mem = NULL;
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_MEM_FAIL);
  }

  /* copy the input parameter into KINSol state */

  kin_mem->kin_func = func;

  /* set the linear solver addresses to NULL */

  kin_mem->kin_linit  = NULL;
  kin_mem->kin_lsetup = NULL;
  kin_mem->kin_lsolve = NULL;
  kin_mem->kin_lfree  = NULL;
  kin_mem->kin_lmem   = NULL;

  /* initialize the QRData and set the QRAdd function if Anderson Acceleration is being used */
  if (kin_mem->kin_m_aa != 0)
  {
    /* Check if vector supports single buffer reductions for dot product */
    if ((kin_mem->kin_vtemp2->ops->nvdotprodlocal ||
         kin_mem->kin_vtemp2->ops->nvdotprodmultilocal) &&
        kin_mem->kin_vtemp2->ops->nvdotprodmultiallreduce)
    {
      kin_mem->kin_dot_prod_sb = SUNTRUE;
    }

    if (kin_mem->kin_orth_aa == KIN_ORTH_MGS)
    {
      kin_mem->kin_qr_func        = (SUNQRAddFn)SUNQRAdd_MGS;
      kin_mem->kin_qr_data->vtemp = kin_mem->kin_vtemp2;
    }
    else if (kin_mem->kin_orth_aa == KIN_ORTH_ICWY)
    {
      if (kin_mem->kin_dot_prod_sb)
      {
        kin_mem->kin_qr_func = (SUNQRAddFn)SUNQRAdd_ICWY_SB;
      }
      else { kin_mem->kin_qr_func = (SUNQRAddFn)SUNQRAdd_ICWY; }
      kin_mem->kin_qr_data->vtemp      = kin_mem->kin_vtemp2;
      kin_mem->kin_qr_data->vtemp2     = kin_mem->kin_vtemp3;
      kin_mem->kin_qr_data->temp_array = kin_mem->kin_T_aa;
    }
    else if (kin_mem->kin_orth_aa == KIN_ORTH_CGS2)
    {
      kin_mem->kin_qr_func             = (SUNQRAddFn)SUNQRAdd_CGS2;
      kin_mem->kin_qr_data->vtemp      = kin_mem->kin_vtemp2;
      kin_mem->kin_qr_data->vtemp2     = kin_mem->kin_vtemp3;
      kin_mem->kin_qr_data->temp_array = kin_mem->kin_cv;
    }
    else if (kin_mem->kin_orth_aa == KIN_ORTH_DCGS2)
    {
      if (kin_mem->kin_dot_prod_sb)
      {
        kin_mem->kin_qr_func = (SUNQRAddFn)SUNQRAdd_DCGS2_SB;
      }
      else { kin_mem->kin_qr_func = (SUNQRAddFn)SUNQRAdd_DCGS2; }
      kin_mem->kin_qr_data->vtemp      = kin_mem->kin_vtemp2;
      kin_mem->kin_qr_data->vtemp2     = kin_mem->kin_vtemp3;
      kin_mem->kin_qr_data->temp_array = kin_mem->kin_cv;
    }
  }

  /* problem memory has been successfully allocated */

  kin_mem->kin_MallocDone = SUNTRUE;

  SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
  return (KIN_SUCCESS);
}